

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_definedUnitsStandardUnit_Test::TestBody(Units_definedUnitsStandardUnit_Test *this)

{
  element_type *peVar1;
  AssertHelper local_60 [8];
  Message local_58 [8];
  char *local_50 [4];
  AssertionResult gtest_ar_;
  UnitsPtr u;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"only_standard_units",(allocator<char> *)&gtest_ar_);
  libcellml::Units::create((string *)&u);
  std::__cxx11::string::~string((string *)local_50);
  peVar1 = u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"second",(allocator<char> *)&gtest_ar_);
  libcellml::Units::addUnit((string *)peVar1);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"farad",(allocator<char> *)&gtest_ar_);
  libcellml::Units::addUnit
            ((string *)u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)local_50);
  gtest_ar_.success_ = (bool)libcellml::Units::isDefined();
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message(local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_50,&gtest_ar_.success_,"u->isDefined()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xd57,local_50[0]);
    testing::internal::AssertHelper::operator=(local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    std::__cxx11::string::~string((string *)local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, definedUnitsStandardUnit)
{
    libcellml::UnitsPtr u = libcellml::Units::create("only_standard_units");
    u->addUnit("second");
    u->addUnit("farad");

    EXPECT_TRUE(u->isDefined());
}